

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

double __thiscall smf::MidiFile::getTimeInSeconds(MidiFile *this,int tickvalue)

{
  pointer __base;
  void *pvVar1;
  double dVar2;
  _TickTime key;
  int local_20 [2];
  undefined8 local_18;
  
  if ((this->m_timemapvalid == false) && (buildTimeMap(this), this->m_timemapvalid == false)) {
    return -1.0;
  }
  local_18 = 0xbff0000000000000;
  __base = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_20[0] = tickvalue;
  pvVar1 = bsearch(local_20,__base,
                   (long)(this->m_timemap).
                         super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)__base >> 4,0x10,ticksearch);
  if (pvVar1 == (void *)0x0) {
    dVar2 = linearSecondInterpolationAtTick(this,tickvalue);
  }
  else {
    dVar2 = *(double *)((long)pvVar1 + 8);
  }
  return dVar2;
}

Assistant:

double MidiFile::getTimeInSeconds(int tickvalue) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	_TickTime key;
	key.tick    = tickvalue;
	key.seconds = -1;

	void* ptr = bsearch(&key, m_timemap.data(), m_timemap.size(),
			sizeof(_TickTime), ticksearch);

	if (ptr == NULL) {
		// The specific tick value was not found, so do a linear
		// search for the two tick values which occur before and
		// after the tick value, and do a linear interpolation of
		// the time in seconds values to figure out the final
		// time in seconds.
		// Since the code is not yet written, kill the program at this point:
		return linearSecondInterpolationAtTick(tickvalue);
	} else {
		return ((_TickTime*)ptr)->seconds;
	}
}